

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

aura_transport * aura_transport_lookup(char *name)

{
  int iVar1;
  list_head *__mptr_1;
  list_head *__mptr;
  aura_transport *pos;
  char *name_local;
  
  __mptr = transports.next + -5;
  while( true ) {
    if (__mptr == (list_head *)&PTR_slog_sprintf_00114450) {
      return (aura_transport *)0x0;
    }
    iVar1 = strcmp((char *)__mptr->next,name);
    if (iVar1 == 0) break;
    __mptr = __mptr[5].next + -5;
  }
  *(int *)&__mptr[4].prev = *(int *)&__mptr[4].prev + 1;
  return (aura_transport *)__mptr;
}

Assistant:

const struct aura_transport *aura_transport_lookup(const char *name)
{
	struct aura_transport *pos;

	list_for_each_entry(pos, &transports, registry)
	if (strcmp(pos->name, name) == 0) {
		pos->usage++;
		return pos;
	}
	return NULL;
}